

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O0

void __thiscall
Memory::HeapBlockMap32::InduceFalsePositives(HeapBlockMap32 *this,Recycler *recycler)

{
  L2MapChunk *pLVar1;
  SmallHeapBlockT<SmallAllocationBlockAttributes> *this_00;
  bool bVar2;
  void *candidate;
  HeapBlock *block;
  uint j;
  L2MapChunk *chunk;
  uint i;
  Recycler *recycler_local;
  HeapBlockMap32 *this_local;
  
  for (chunk._4_4_ = 0; chunk._4_4_ < 0x1000; chunk._4_4_ = chunk._4_4_ + 1) {
    pLVar1 = this->map[chunk._4_4_];
    if (pLVar1 != (L2MapChunk *)0x0) {
      for (block._4_4_ = 0; block._4_4_ < 0x100; block._4_4_ = block._4_4_ + 1) {
        this_00 = (SmallHeapBlockT<SmallAllocationBlockAttributes> *)pLVar1->map[block._4_4_];
        if (this_00 == (SmallHeapBlockT<SmallAllocationBlockAttributes> *)0x0) {
          candidate = GetAddressFromIds(chunk._4_4_,block._4_4_);
          Recycler::TryMarkNonInterior(recycler,candidate,(void *)0x0);
        }
        else {
          bVar2 = HeapBlock::IsLargeHeapBlock((HeapBlock *)this_00);
          if (!bVar2) {
            SmallHeapBlockT<SmallAllocationBlockAttributes>::InduceFalsePositive(this_00,recycler);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void
HeapBlockMap32::InduceFalsePositives(Recycler * recycler)
{
    for (uint i = 0; i < L1Count; i++)
    {
        L2MapChunk * chunk = map[i];
        if (chunk == nullptr)
        {
            continue;
        }

        for (uint j = 0; j < L2Count; j++)
        {
            HeapBlock * block = chunk->map[j];

            if (block == nullptr)
            {
                // Unallocated block.  Try to mark the first offset, in case
                // we are simultaneously allocating this block on the main thread.
                recycler->TryMarkNonInterior((void *)GetAddressFromIds(i, j), nullptr);
            }
            else if (!block->IsLargeHeapBlock())
            {
                ((SmallHeapBlock *)block)->InduceFalsePositive(recycler);
            }
        }
    }
}